

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests_exhaustive.c
# Opt level: O1

int main(int argc,char **argv)

{
  uint *pk_parity;
  undefined4 *puVar1;
  byte bVar2;
  byte bVar3;
  bool bVar4;
  bool bVar5;
  uint64_t uVar6;
  secp256k1_callback *error_callback;
  int i;
  int iVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  long lVar11;
  FILE *__stream;
  size_t sVar12;
  secp256k1_ge *psVar13;
  secp256k1_gej *psVar14;
  secp256k1_context *ctx;
  secp256k1_scratch *scratch;
  size_t sVar15;
  ulong uVar16;
  secp256k1_gej *psVar17;
  secp256k1_scalar *psVar18;
  void *pvVar19;
  void *pvVar20;
  uint64_t *puVar21;
  int j;
  uint uVar22;
  uint uVar23;
  long lVar24;
  secp256k1_fe *psVar25;
  void *pvVar26;
  int *piVar27;
  uint64_t *puVar28;
  ulong uVar29;
  secp256k1_gej *gen;
  secp256k1_gej *gen_00;
  secp256k1_context *extraout_RDX;
  secp256k1_keypair *keypair;
  uchar *puVar30;
  undefined1 *puVar31;
  undefined4 uVar32;
  secp256k1_gej *psVar33;
  uint64_t uVar34;
  secp256k1_pubkey *pubkey;
  uint64_t *puVar35;
  secp256k1_context *psVar36;
  secp256k1_context *a;
  secp256k1_ge *psVar37;
  int iVar38;
  ulong *n_points;
  _func_void_char_ptr_void_ptr *num;
  ulong uVar39;
  int iVar40;
  long lVar41;
  secp256k1_scalar *output32;
  int pos;
  int iVar42;
  undefined4 uVar43;
  char *pcVar44;
  secp256k1_ge *a_00;
  secp256k1_context *a_01;
  ulong uVar45;
  _func_void_char_ptr_void_ptr *p_Var46;
  secp256k1_ge_storage (*pasVar47) [16];
  secp256k1_xonly_pubkey *pubkey_00;
  bool bVar48;
  byte bVar49;
  undefined1 auVar50 [16];
  ulong local_1af8;
  uchar *p1;
  ulong local_1ae8;
  _func_void_char_ptr_void_ptr *local_1ae0;
  ulong local_1ad8;
  char **local_1ac0;
  int local_1ab4;
  secp256k1_callback *local_1ab0;
  long local_1aa8;
  long local_1aa0;
  secp256k1_scalar ng_1;
  undefined1 auStack_1a94 [12];
  secp256k1_fe *psStack_1a90;
  undefined1 local_1a88 [16];
  undefined1 local_1a78 [16];
  int local_1a68;
  uint64_t local_1a60;
  secp256k1_scalar *local_1a58;
  undefined4 local_1a50;
  secp256k1_scalar e;
  secp256k1_scalar ng;
  undefined1 auStack_1a44 [12];
  undefined8 uStack_1a40;
  undefined1 local_1a38 [16];
  int iStack_1a1c;
  secp256k1_scalar na;
  secp256k1_scalar sStack_1a14;
  uint64_t uStack_1a10;
  uint64_t local_1a08;
  uint64_t uStack_1a00;
  undefined4 local_19f8;
  undefined4 uStack_19f4;
  undefined8 uStack_19f0;
  void *local_19e0;
  secp256k1_schnorrsig_extraparams extraparams;
  undefined1 local_19b8 [16];
  undefined1 local_19a8 [16];
  uint64_t local_1990;
  long local_1988;
  secp256k1_ge *local_1980;
  _func_void_char_ptr_void_ptr *local_1978;
  void *local_1970;
  _func_void_char_ptr_void_ptr *local_1968;
  ulong *local_1960;
  secp256k1_gej tmp_3;
  undefined1 local_17f8 [32];
  uchar rand32 [32];
  secp256k1_fe nums_x;
  undefined1 local_1788 [32];
  undefined4 local_1768;
  undefined4 uStack_1764;
  int iStack_1760;
  int iStack_175c;
  int local_1758;
  uint64_t local_14d8 [4];
  secp256k1_scalar scalar_i;
  undefined1 auStack_14b4 [12];
  uint64_t uStack_14b0;
  undefined1 local_14a8 [16];
  undefined1 local_1498 [16];
  undefined1 local_1488 [16];
  uchar seed16 [16];
  byte abStack_1198 [80];
  uint64_t local_1148 [130];
  secp256k1_ge group [13];
  undefined1 auStack_7f0 [8];
  secp256k1_gej groupj [13];
  
  bVar49 = 0;
  setbuf(_stdout,(char *)0x0);
  setbuf(_stderr,(char *)0x0);
  printf("Exhaustive tests for order %lu\n");
  if (1 < argc) {
    lVar11 = strtol(argv[1],(char **)0x0,0);
    count = (int)lVar11;
  }
  pcVar44 = (char *)0x0;
  printf("test count = %i\n",(ulong)(uint)count);
  if (2 < argc) {
    pcVar44 = argv[2];
  }
  seed16[0] = '\0';
  seed16[1] = '\0';
  seed16[2] = '\0';
  seed16[3] = '\0';
  seed16[4] = '\0';
  seed16[5] = '\0';
  seed16[6] = '\0';
  seed16[7] = '\0';
  seed16[8] = '\0';
  seed16[9] = '\0';
  seed16[10] = '\0';
  seed16[0xb] = '\0';
  seed16[0xc] = '\0';
  seed16[0xd] = '\0';
  seed16[0xe] = '\0';
  seed16[0xf] = '\0';
  local_1af8 = (ulong)(uint)argc;
  local_1ac0 = argv;
  if ((pcVar44 == (char *)0x0) || (*pcVar44 == '\0')) {
    __stream = fopen("/dev/urandom","rb");
    if (__stream == (FILE *)0x0) goto LAB_00117ed4;
    sVar12 = fread(seed16,1,0x10,__stream);
    if (sVar12 != 0x10) goto LAB_00117ed4;
    goto LAB_00115add;
  }
  iVar42 = 0;
  while ((((iVar42 < 0x10 && (*pcVar44 != '\0')) && (pcVar44[1] != '\0')) &&
         (iVar7 = __isoc99_sscanf(pcVar44,"%2hx",groupj), iVar7 == 1))) {
    seed16[iVar42] = (uchar)groupj[0].x.n[0];
    pcVar44 = pcVar44 + 2;
    iVar42 = iVar42 + 1;
  }
  while( true ) {
    lVar11 = 0;
    printf("random seed = %02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x\n",
           seed16._0_8_ & 0xff,(ulong)seed16._0_8_ >> 8 & 0xff);
    groupj[0].x.n[0] = 0xbb67ae856a09e667;
    groupj[0].x.n[1] = 0xa54ff53a3c6ef372;
    groupj[0].x.n[2] = 0x9b05688c510e527f;
    groupj[0].x.n[3] = 0x5be0cd191f83d9ab;
    groupj[0].z.n[0] = 0;
    secp256k1_sha256_write((secp256k1_sha256 *)groupj,(uchar *)"secp256k1 test init",0x13);
    secp256k1_sha256_write((secp256k1_sha256 *)groupj,seed16,0x10);
    psVar13 = group;
    secp256k1_sha256_finalize((secp256k1_sha256 *)groupj,(uchar *)psVar13);
    do {
      lVar24 = 0;
      uVar29 = 0;
      do {
        uVar29 = (ulong)*(byte *)((long)(psVar13->x).n + lVar24) | uVar29 << 8;
        lVar24 = lVar24 + 1;
      } while (lVar24 != 8);
      secp256k1_test_state[lVar11] = uVar29;
      lVar11 = lVar11 + 1;
      psVar13 = (secp256k1_ge *)((psVar13->x).n + 1);
    } while (lVar11 != 4);
    if (4 < (int)local_1af8) {
      lVar11 = strtol(local_1ac0[3],(char **)0x0,0);
      num_cores = (uint32_t)lVar11;
      uVar29 = strtol(local_1ac0[4],(char **)0x0,0);
      this_core = (uint32_t)uVar29;
      if (((ulong)num_cores == 0) || (num_cores <= this_core)) {
        main_cold_2();
        return 1;
      }
      printf("running tests for core %lu (out of [0..%lu])\n",uVar29 & 0xffffffff,
             (ulong)num_cores - 1);
    }
    psVar36 = (secp256k1_context *)0x1a000;
    psVar13 = (secp256k1_ge *)malloc(0x1a000);
    if (psVar13 == (secp256k1_ge *)0x0) break;
    secp256k1_gej_set_ge(groupj,&secp256k1_ge_const_g);
    a = (secp256k1_context *)&nums_x;
    secp256k1_fe_impl_set_b32_mod((secp256k1_fe *)a,(uchar *)"The scalar for this x is unknown");
    bVar4 = (nums_x.n[2] & nums_x.n[3] & nums_x.n[1]) == 0xfffffffffffff;
    bVar5 = nums_x.n[4] == 0xffffffffffff;
    bVar48 = 0xffffefffffc2e < nums_x.n[0];
    if (bVar48 && (bVar4 && bVar5)) {
      nums_x.magnitude = -1;
    }
    else {
      a = (secp256k1_context *)&nums_x;
      nums_x.magnitude = 1;
      nums_x.normalized = 1;
      secp256k1_fe_verify((secp256k1_fe *)a);
    }
    if (bVar48 && (bVar4 && bVar5)) goto LAB_00117f43;
    a = (secp256k1_context *)seed16;
    iVar42 = secp256k1_ge_set_xo_var((secp256k1_ge *)a,&nums_x,0);
    if (iVar42 == 0) goto LAB_00117f48;
    secp256k1_gej_set_ge((secp256k1_gej *)group,(secp256k1_ge *)seed16);
    psVar25 = (secp256k1_fe *)0x0;
    secp256k1_gej_add_ge_var
              ((secp256k1_gej *)group,(secp256k1_gej *)group,&secp256k1_ge_const_g,
               (secp256k1_fe *)0x0);
    psVar36 = (secp256k1_context *)0x26000;
    psVar14 = (secp256k1_gej *)malloc(0x26000);
    if (psVar14 == (secp256k1_gej *)0x0) goto LAB_00117f7a;
    memcpy(seed16,groupj,0x98);
    memcpy(&nums_x,group,0x98);
    lVar11 = 0;
    psVar17 = psVar14;
    do {
      memcpy(psVar14 + lVar11 * 0x10,&nums_x,0x98);
      lVar24 = 0xf;
      psVar33 = psVar17;
      do {
        secp256k1_gej_add_var(psVar33 + 1,psVar33,(secp256k1_gej *)seed16,psVar25);
        lVar24 = lVar24 + -1;
        psVar33 = psVar33 + 1;
      } while (lVar24 != 0);
      iVar42 = 4;
      do {
        secp256k1_gej_double_var
                  ((secp256k1_gej *)seed16,(secp256k1_gej *)seed16,(secp256k1_fe *)0x0);
        iVar42 = iVar42 + -1;
      } while (iVar42 != 0);
      secp256k1_gej_double_var
                ((secp256k1_gej *)&nums_x,(secp256k1_gej *)&nums_x,(secp256k1_fe *)0x0);
      if (lVar11 == 0x3e) {
        secp256k1_gej_neg((secp256k1_gej *)&nums_x,(secp256k1_gej *)&nums_x);
        secp256k1_gej_add_var
                  ((secp256k1_gej *)&nums_x,(secp256k1_gej *)&nums_x,(secp256k1_gej *)group,psVar25)
        ;
      }
      lVar11 = lVar11 + 1;
      psVar17 = psVar17 + 0x10;
    } while (lVar11 != 0x40);
    lVar11 = -1;
    lVar41 = 0;
    lVar24 = 0;
    psVar37 = psVar13;
    do {
      secp256k1_gej_verify((secp256k1_gej *)((long)(psVar14->x).n + lVar41));
      if (*(int *)((long)(&psVar14->z + 1) + lVar41) == 0) {
        if (lVar11 == -1) {
          puVar28 = (uint64_t *)((long)(psVar14->z).n + lVar41);
          uVar34 = *puVar28;
          uVar6 = puVar28[1];
          auVar50 = *(undefined1 (*) [16])((long)(psVar14->z).n + lVar41 + 0x10);
          puVar1 = (undefined4 *)((long)(psVar14->z).n + lVar41 + 0x20);
          uVar43 = puVar1[1];
          iVar42 = puVar1[2];
          iVar7 = puVar1[3];
          *(undefined4 *)((psVar37->x).n + 4) = *puVar1;
          *(undefined4 *)((long)(psVar37->x).n + 0x24) = uVar43;
          (psVar37->x).magnitude = iVar42;
          (psVar37->x).normalized = iVar7;
          *(undefined1 (*) [16])((psVar37->x).n + 2) = auVar50;
          (psVar37->x).n[0] = uVar34;
          (psVar37->x).n[1] = uVar6;
          lVar11 = lVar24;
        }
        else {
          secp256k1_fe_mul(&psVar37->x,&psVar13[lVar11].x,
                           (secp256k1_fe *)((long)(psVar14->z).n + lVar41));
          lVar11 = lVar24;
        }
      }
      else {
        secp256k1_ge_set_infinity(psVar37);
      }
      lVar24 = lVar24 + 1;
      psVar37 = psVar37 + 1;
      lVar41 = lVar41 + 0x98;
    } while (lVar24 != 0x400);
    if (lVar11 != -1) {
      a = (secp256k1_context *)&scalar_i;
      secp256k1_fe_inv_var((secp256k1_fe *)a,&psVar13[lVar11].x);
      if (lVar11 != 0) {
        psVar37 = psVar13 + lVar11;
        piVar27 = &psVar14[lVar11 + -1].infinity;
        lVar24 = lVar11;
        do {
          lVar24 = lVar24 + -1;
          psVar37 = psVar37 + -1;
          if (*piVar27 == 0) {
            a = (secp256k1_context *)&scalar_i;
            secp256k1_fe_mul(&psVar13[lVar11].x,&psVar37->x,(secp256k1_fe *)a);
            secp256k1_fe_mul((secp256k1_fe *)a,(secp256k1_fe *)a,&psVar14[lVar11].z);
            lVar11 = lVar24;
          }
          piVar27 = piVar27 + -0x26;
        } while (lVar24 != 0);
      }
      if (psVar14[lVar11].infinity != 0) goto LAB_00117f4d;
      psVar25 = &psVar13[lVar11].x;
      *(undefined4 *)(psVar25->n + 4) = local_1498._0_4_;
      *(undefined4 *)((long)psVar25->n + 0x24) = local_1498._4_4_;
      *(undefined4 *)(psVar25->n + 4 + 1) = local_1498._8_4_;
      psVar25->normalized = local_1498._12_4_;
      *(undefined1 (*) [16])(psVar13[lVar11].x.n + 2) = local_14a8;
      psVar13[lVar11].x.n[0] = _scalar_i;
      psVar13[lVar11].x.n[1] = uStack_14b0;
      lVar11 = 0;
      psVar17 = psVar14;
      do {
        if (psVar17->infinity == 0) {
          psVar37 = (secp256k1_ge *)((long)(psVar13->x).n + lVar11);
          secp256k1_ge_set_gej_zinv(psVar37,psVar17,(secp256k1_fe *)psVar37);
        }
        secp256k1_ge_verify((secp256k1_ge *)((long)(psVar13->x).n + lVar11));
        lVar11 = lVar11 + 0x68;
        psVar17 = psVar17 + 1;
      } while (lVar11 != 0x1a000);
    }
    free(psVar14);
    pasVar47 = secp256k1_ecmult_gen_prec_table;
    lVar11 = 0;
    psVar37 = psVar13;
    do {
      lVar24 = 0;
      a_00 = psVar37;
      do {
        secp256k1_ge_to_storage((secp256k1_ge_storage *)((long)(*pasVar47)[0].x.n + lVar24),a_00);
        lVar24 = lVar24 + 0x40;
        a_00 = a_00 + 1;
      } while (lVar24 != 0x400);
      lVar11 = lVar11 + 1;
      psVar37 = psVar37 + 0x10;
      pasVar47 = pasVar47 + 1;
    } while (lVar11 != 0x40);
    free(psVar13);
    secp256k1_gej_set_ge(groupj,&secp256k1_ge_const_g);
    secp256k1_ecmult_compute_table(secp256k1_pre_g,(int)groupj,gen);
    iVar42 = 0x80;
    do {
      secp256k1_gej_double_var(groupj,groupj,(secp256k1_fe *)0x0);
      iVar42 = iVar42 + -1;
    } while (iVar42 != 0);
    secp256k1_ecmult_compute_table(secp256k1_pre_g_128,(int)groupj,gen_00);
    iVar42 = count;
joined_r0x001160d6:
    count = iVar42 + -1;
    if (iVar42 == 0) {
      secp256k1_testrand256(seed16);
      printf("random run = %02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x\n",
             seed16._0_8_ & 0xff,(ulong)seed16._0_8_ >> 8 & 0xff,(ulong)seed16._0_8_ >> 0x10 & 0xff,
             (ulong)seed16._0_8_ >> 0x18 & 0xff,(ulong)seed16._0_8_ >> 0x20 & 0xff,
             (ulong)seed16._0_8_ >> 0x28 & 0xff,(ulong)seed16._0_8_ >> 0x30 & 0xff,
             (ulong)seed16._0_8_ >> 0x38,seed16._8_8_ & 0xff,(ulong)seed16._8_8_ >> 8 & 0xff,
             (ulong)seed16._8_8_ >> 0x10 & 0xff,(ulong)seed16._8_8_ >> 0x18 & 0xff,
             (ulong)seed16._8_8_ >> 0x20 & 0xff,(ulong)seed16._8_8_ >> 0x28 & 0xff,
             (ulong)seed16._8_8_ >> 0x30 & 0xff,(ulong)seed16._8_8_ >> 0x38);
      puts("no problems found");
      return 0;
    }
    ctx = secp256k1_context_create(1);
    secp256k1_testrand256(rand32);
    a = ctx;
    iVar42 = secp256k1_context_randomize(ctx,rand32);
    if (iVar42 == 0) goto LAB_00117f52;
    secp256k1_gej_set_infinity(groupj);
    secp256k1_ge_set_gej(group,groupj);
    lVar11 = -0x4e0;
    iVar42 = 1;
    psVar14 = groupj;
    do {
      psVar17 = psVar14 + 1;
      secp256k1_gej_add_ge(psVar17,psVar14,&secp256k1_ge_const_g);
      secp256k1_ge_set_gej((secp256k1_ge *)(auStack_7f0 + lVar11),psVar17);
      if (count != 0) {
        random_fe((secp256k1_fe *)seed16);
        secp256k1_gej_rescale(psVar17,(secp256k1_fe *)seed16);
      }
      scalar_i = iVar42;
      secp256k1_ecmult_gen(&ctx->ecmult_gen_ctx,(secp256k1_gej *)seed16,&scalar_i);
      a = (secp256k1_context *)&nums_x;
      secp256k1_ge_set_gej((secp256k1_ge *)a,(secp256k1_gej *)seed16);
      if (*(int *)((long)groupj[0].y.n + lVar11 + 0x28) != 0) goto LAB_00117f1b;
      if (local_1758 != 0) goto LAB_00117f20;
      a = (secp256k1_context *)&nums_x;
      iVar7 = secp256k1_fe_equal_var((secp256k1_fe *)a,(secp256k1_fe *)(auStack_7f0 + lVar11));
      if (iVar7 == 0) goto LAB_00117f25;
      a = (secp256k1_context *)local_1788;
      iVar7 = secp256k1_fe_equal_var
                        ((secp256k1_fe *)a,(secp256k1_fe *)((long)groupj[0].x.n + lVar11 + 0x28));
      if (iVar7 == 0) goto LAB_00117f2a;
      iVar42 = iVar42 + 1;
      lVar11 = lVar11 + 0x68;
      psVar14 = psVar17;
    } while (lVar11 != 0);
    uVar29 = 0;
    psVar13 = group;
    lVar11 = 0;
    do {
      secp256k1_ge_mul_lambda((secp256k1_ge *)seed16,(secp256k1_ge *)((long)group[0].x.n + lVar11));
      ge_equals_ge(psVar13 + (uVar29 / 0xd) * -0xd,(secp256k1_ge *)seed16);
      lVar11 = lVar11 + 0x68;
      psVar13 = psVar13 + 9;
      uVar29 = uVar29 + 9;
    } while (lVar11 != 0x548);
    a = (secp256k1_context *)group;
    secp256k1_ge_verify((secp256k1_ge *)a);
    if (group[0].infinity == 0) goto LAB_00117f57;
    a = (secp256k1_context *)groupj;
    secp256k1_gej_verify((secp256k1_gej *)a);
    if (groupj[0].infinity == 0) goto LAB_00117f5c;
    lVar11 = 0xc;
    psVar13 = group;
    psVar14 = groupj;
    do {
      a_01 = (secp256k1_context *)(psVar14 + 1);
      psVar36 = (secp256k1_context *)(psVar13 + 1);
      a = psVar36;
      secp256k1_ge_verify((secp256k1_ge *)psVar36);
      if ((psVar36->ecmult_gen_ctx).initial.y.magnitude != 0) goto LAB_00117f2f;
      a = a_01;
      secp256k1_gej_verify((secp256k1_gej *)a_01);
      if ((a_01->ecmult_gen_ctx).initial.z.magnitude != 0) goto LAB_00117f34;
      psVar14 = (secp256k1_gej *)&a_01->ecmult_gen_ctx;
      psVar13 = (secp256k1_ge *)&psVar36->ecmult_gen_ctx;
      lVar11 = lVar11 + -1;
    } while (lVar11 != 0);
    p1 = (uchar *)group;
    local_1ae8 = 0;
    local_1ad8 = 0;
    do {
      bVar48 = true;
      if ((ulong)num_cores != 1) {
        local_1ad8 = local_1ad8 + 0xe7037ed1a0b428db;
        bVar48 = (uint32_t)
                 ((local_1ad8 >> 0x20 ^ local_1ad8 & 0xffffffff) * (ulong)num_cores >> 0x20) ==
                 this_core;
      }
      if (bVar48) {
        secp256k1_fe_inv((secp256k1_fe *)&scalar_i,&groupj[local_1ae8].z);
        lVar11 = 0;
        uVar29 = local_1ae8;
        puVar30 = p1;
        do {
          psVar13 = (secp256k1_ge *)(puVar30 + (uVar29 / 0xd) * -0x548);
          psVar14 = (secp256k1_gej *)((long)groupj[0].x.n + lVar11);
          secp256k1_gej_add_var
                    ((secp256k1_gej *)seed16,psVar14,groupj + local_1ae8,
                     (secp256k1_fe *)0x4ec4ec4ec4ec4ec5);
          ge_equals_gej(psVar13,(secp256k1_gej *)seed16);
          if (local_1ae8 != 0) {
            secp256k1_gej_add_ge((secp256k1_gej *)seed16,psVar14,group + local_1ae8);
            ge_equals_gej(psVar13,(secp256k1_gej *)seed16);
          }
          secp256k1_gej_add_ge_var
                    ((secp256k1_gej *)seed16,psVar14,group + local_1ae8,(secp256k1_fe *)0x0);
          ge_equals_gej(psVar13,(secp256k1_gej *)seed16);
          local_1758 = groupj[local_1ae8].infinity;
          nums_x.n[4] = groupj[local_1ae8].x.n[4];
          nums_x.magnitude = groupj[local_1ae8].x.magnitude;
          nums_x.normalized = groupj[local_1ae8].x.normalized;
          nums_x.n[3] = groupj[local_1ae8].x.n[3];
          nums_x.n[2] = groupj[local_1ae8].x.n[2];
          nums_x.n[1] = groupj[local_1ae8].x.n[1];
          nums_x.n[0] = groupj[local_1ae8].x.n[0];
          local_1788._0_8_ = groupj[local_1ae8].y.n[0];
          local_1788._8_8_ = groupj[local_1ae8].y.n[1];
          local_1788._16_16_ = *(undefined1 (*) [16])(groupj[local_1ae8].y.n + 2);
          local_1768 = (undefined4)groupj[local_1ae8].y.n[4];
          uStack_1764 = *(undefined4 *)((long)groupj[local_1ae8].y.n + 0x24);
          iStack_1760 = groupj[local_1ae8].y.magnitude;
          iStack_175c = groupj[local_1ae8].y.normalized;
          secp256k1_gej_add_zinv_var
                    ((secp256k1_gej *)seed16,psVar14,(secp256k1_ge *)&nums_x,
                     (secp256k1_fe *)&scalar_i);
          ge_equals_gej(psVar13,(secp256k1_gej *)seed16);
          lVar11 = lVar11 + 0x98;
          puVar30 = puVar30 + 0x68;
          uVar29 = uVar29 + 1;
        } while (lVar11 != 0x7b8);
      }
      local_1ae8 = local_1ae8 + 1;
      p1 = p1 + 0x68;
    } while (local_1ae8 != 0xd);
    uVar29 = 0;
    psVar13 = group;
    lVar11 = 0;
    do {
      psVar14 = (secp256k1_gej *)((long)groupj[0].x.n + lVar11);
      secp256k1_gej_double((secp256k1_gej *)seed16,psVar14);
      ge_equals_gej(psVar13 + (uVar29 / 0xd) * -0xd,(secp256k1_gej *)seed16);
      secp256k1_gej_double_var((secp256k1_gej *)seed16,psVar14,(secp256k1_fe *)0x0);
      ge_equals_gej(psVar13 + (uVar29 / 0xd) * -0xd,(secp256k1_gej *)seed16);
      lVar11 = lVar11 + 0x98;
      psVar13 = psVar13 + 2;
      uVar29 = uVar29 + 2;
    } while (lVar11 != 0x7b8);
    lVar11 = 0x68;
    psVar13 = group + 0xc;
    psVar14 = groupj;
    do {
      psVar14 = psVar14 + 1;
      secp256k1_ge_neg((secp256k1_ge *)&nums_x,(secp256k1_ge *)((long)group[0].x.n + lVar11));
      ge_equals_ge(psVar13,(secp256k1_ge *)&nums_x);
      secp256k1_gej_neg((secp256k1_gej *)seed16,psVar14);
      ge_equals_gej(psVar13,(secp256k1_gej *)seed16);
      lVar11 = lVar11 + 0x68;
      psVar13 = psVar13 + -1;
    } while (lVar11 != 0x548);
    lVar11 = 1;
    lVar24 = 0x68;
    local_1ad8 = 0;
    do {
      uVar29 = 0;
      p1 = (uchar *)group;
      do {
        bVar48 = true;
        if ((ulong)num_cores != 1) {
          local_1ad8 = local_1ad8 + 0xe7037ed1a0b428db;
          bVar48 = (uint32_t)
                   ((local_1ad8 >> 0x20 ^ local_1ad8 & 0xffffffff) * (ulong)num_cores >> 0x20) ==
                   this_core;
        }
        if (bVar48) {
          iVar42 = 0;
          puVar30 = p1;
          uVar45 = uVar29;
          do {
            _na = CONCAT44(sStack_1a14,iVar42);
            ng = (int)uVar29;
            psStack_1a90 = &nums_x;
            _ng_1 = (secp256k1_fe *)&scalar_i;
            local_1a88._0_8_ = seed16;
            secp256k1_ecmult_strauss_wnaf
                      ((secp256k1_strauss_state *)&ng_1,&tmp_3,1,groupj + lVar11,&na,&ng);
            ge_equals_gej((secp256k1_ge *)(puVar30 + (uVar45 / 0xd) * -0x548),&tmp_3);
            iVar42 = iVar42 + 1;
            puVar30 = puVar30 + lVar24;
            uVar45 = uVar45 + lVar11;
          } while (iVar42 != 0xd);
        }
        n_points = (ulong *)&na;
        uVar29 = uVar29 + 1;
        p1 = p1 + 0x68;
      } while ((int)uVar29 != 0xd);
      lVar11 = lVar11 + 1;
      lVar24 = lVar24 + 0x68;
    } while (lVar11 != 0xd);
    local_1af8 = 0;
LAB_00116849:
    lVar11 = 0;
LAB_00116850:
    bVar48 = true;
    if ((ulong)num_cores != 1) {
      local_1ad8 = local_1ad8 + 0xe7037ed1a0b428db;
      bVar48 = (uint32_t)((local_1ad8 >> 0x20 ^ local_1ad8 & 0xffffffff) * (ulong)num_cores >> 0x20)
               == this_core;
    }
    if (!bVar48) goto LAB_00116a13;
    ng_1 = (int)local_1af8;
    psVar13 = group + lVar11;
    secp256k1_ecmult_const((secp256k1_gej *)seed16,psVar13,&ng_1);
    uVar8 = (int)lVar11 * (int)local_1af8;
    __stream = (FILE *)(group + (uVar8 - (uVar8 / 0xd + (uVar8 / 0xd) * 0xc)));
    ge_equals_gej((secp256k1_ge *)__stream,(secp256k1_gej *)seed16);
    if (lVar11 == 0 || local_1af8 == 0) goto LAB_00116a13;
    a = (secp256k1_context *)&tmp_3;
    psVar36 = a;
    iVar42 = secp256k1_ecmult_const_xonly((secp256k1_fe *)a,&psVar13->x,(secp256k1_fe *)0x0,&ng_1,0)
    ;
    if (iVar42 == 0) goto LAB_00117f07;
    iVar42 = secp256k1_fe_equal_var((secp256k1_fe *)a,(secp256k1_fe *)__stream);
    psVar36 = a;
    if (iVar42 == 0) goto LAB_00117f0c;
    iVar42 = -0xb;
    while( true ) {
      iVar42 = iVar42 + 1;
      if (iVar42 == 0) goto LAB_00117f3e;
      a = (secp256k1_context *)&scalar_i;
      random_fe((secp256k1_fe *)a);
      secp256k1_fe_normalize((secp256k1_fe *)a);
      secp256k1_fe_verify((secp256k1_fe *)a);
      if (local_1498._12_4_ == 0) break;
      if ((SUB168(local_14a8 | _scalar_i,8) != 0 || SUB168(local_14a8 | _scalar_i,0) != 0) ||
          local_1498._0_8_ != 0) goto code_r0x001169b1;
    }
    main_cold_40();
LAB_00117ed4:
    main_cold_1();
LAB_00115add:
    if (__stream != (FILE *)0x0) {
      fclose(__stream);
    }
  }
LAB_00117f75:
  main_cold_52();
LAB_00117f7a:
  main_cold_49();
LAB_00117f7f:
  main_cold_37();
LAB_00117f84:
  main_cold_36();
LAB_00117f89:
  main_cold_35();
LAB_00117f8e:
  main_cold_34();
LAB_00117f93:
  main_cold_33();
LAB_00117f98:
  main_cold_32();
LAB_00117f9d:
  main_cold_12();
LAB_00117fa2:
  main_cold_31();
LAB_00117fa7:
  main_cold_13();
LAB_00117fac:
  main_cold_30();
LAB_00117fb1:
  main_cold_14();
LAB_00117fb6:
  a = psVar36;
  main_cold_29();
LAB_00117fbb:
  main_cold_28();
LAB_00117fc0:
  main_cold_15();
LAB_00117fc5:
  main_cold_18();
LAB_00117fca:
  main_cold_27();
LAB_00117fcf:
  main_cold_26();
LAB_00117fd4:
  main_cold_25();
LAB_00117fd9:
  main_cold_16();
LAB_00117fde:
  main_cold_17();
LAB_00117fe3:
  main_cold_22();
LAB_00117fe8:
  main_cold_23();
  lVar11 = 0;
  do {
    uVar34 = ((secp256k1_test_state[3] + secp256k1_test_state[0]) * 0x800000 |
             secp256k1_test_state[3] + secp256k1_test_state[0] >> 0x29) + secp256k1_test_state[0];
    uVar16 = secp256k1_test_state[1] << 0x11;
    uVar45 = secp256k1_test_state[2] ^ secp256k1_test_state[0];
    uVar29 = secp256k1_test_state[3] ^ secp256k1_test_state[1];
    secp256k1_test_state[1] = secp256k1_test_state[1] ^ uVar45;
    secp256k1_test_state[0] = secp256k1_test_state[0] ^ uVar29;
    secp256k1_test_state[3] = uVar29 << 0x2d | uVar29 >> 0x13;
    secp256k1_test_state[2] = uVar45 ^ uVar16;
    (a->ecmult_gen_ctx).initial.x.n[lVar11 + -1] = uVar34;
    lVar11 = lVar11 + 1;
  } while ((int)lVar11 != 4);
  return (int)secp256k1_test_state[0];
code_r0x001169b1:
  secp256k1_fe_mul(&nums_x,(secp256k1_fe *)&scalar_i,&psVar13->x);
  a = (secp256k1_context *)&tmp_3;
  n_points = (ulong *)0x0;
  psVar36 = a;
  iVar42 = secp256k1_ecmult_const_xonly((secp256k1_fe *)a,&nums_x,(secp256k1_fe *)&scalar_i,&ng_1,0)
  ;
  if (iVar42 == 0) goto LAB_00117f11;
  iVar42 = secp256k1_fe_equal_var((secp256k1_fe *)a,(secp256k1_fe *)__stream);
  if (iVar42 == 0) goto LAB_00117f16;
LAB_00116a13:
  lVar11 = lVar11 + 1;
  if (lVar11 == 0xd) goto code_r0x00116a25;
  goto LAB_00116850;
code_r0x00116a25:
  local_1af8 = local_1af8 + 1;
  if (local_1af8 == 0xd) goto code_r0x00116a32;
  goto LAB_00116849;
code_r0x00116a32:
  local_1ab0 = &ctx->error_callback;
  scratch = secp256k1_scratch_create(local_1ab0,0x1000);
  local_1aa8 = 0;
  local_19e0 = (void *)0x0;
  do {
    uVar34 = 0;
    do {
      local_1aa0 = 0;
      local_1990 = uVar34;
      do {
        local_1a60 = 0;
        do {
          bVar48 = true;
          if ((ulong)num_cores != 1) {
            local_19e0 = (void *)((long)local_19e0 + 0xe7037ed1a0b428db);
            bVar48 = (uint32_t)
                     (((ulong)local_19e0 >> 0x20 ^ (ulong)local_19e0 & 0xffffffff) *
                      (ulong)num_cores >> 0x20) == this_core;
          }
          if (bVar48) {
            local_1980 = group + local_1a60;
            local_1988 = local_1a60 * local_1aa8 + local_1aa0;
            p_Var46 = (_func_void_char_ptr_void_ptr *)0x0;
            do {
              uVar43 = (undefined4)local_1aa8;
              uVar32 = (undefined4)uVar34;
              seed16[0] = (uchar)uVar43;
              seed16[1] = (uchar)((uint)uVar43 >> 8);
              seed16[2] = (uchar)((uint)uVar43 >> 0x10);
              seed16[3] = (uchar)((uint)uVar43 >> 0x18);
              seed16[4] = (uchar)uVar32;
              seed16[5] = (uchar)((uint)uVar32 >> 8);
              seed16[6] = (uchar)((uint)uVar32 >> 0x10);
              seed16[7] = (uchar)((uint)uVar32 >> 0x18);
              _na = CONCAT44(sStack_1a14,(int)local_1aa0);
              psVar13 = local_1980;
              puVar28 = (uint64_t *)(seed16 + 8);
              for (lVar11 = 0xd; lVar11 != 0; lVar11 = lVar11 + -1) {
                *puVar28 = (psVar13->x).n[0];
                psVar13 = (secp256k1_ge *)((long)psVar13 + (ulong)bVar49 * -0x10 + 8);
                puVar28 = puVar28 + (ulong)bVar49 * -2 + 1;
              }
              local_1978 = p_Var46;
              psVar13 = group + (long)p_Var46;
              puVar28 = local_1148;
              for (pvVar26 = (void *)0xd; pvVar26 != (void *)0x0;
                  pvVar26 = (void *)((long)pvVar26 + -1)) {
                *puVar28 = (psVar13->x).n[0];
                psVar13 = (secp256k1_ge *)((long)psVar13 + (ulong)bVar49 * -0x10 + 8);
                puVar28 = puVar28 + (ulong)bVar49 * -2 + 1;
              }
              secp256k1_gej_set_infinity((secp256k1_gej *)&scalar_i);
              if (scratch == (secp256k1_scratch *)0x0) {
LAB_00116c61:
                secp256k1_ecmult_multi_simple_var
                          ((secp256k1_gej *)&scalar_i,&na,(secp256k1_ecmult_multi_callback *)seed16,
                           pvVar26,(size_t)n_points);
              }
              else {
                sVar15 = secp256k1_scratch_max_allocation(local_1ab0,scratch,6);
                pvVar26 = (void *)0x1;
                n_points = &DAT_0012a198;
                uVar29 = 0;
                do {
                  if (pvVar26 == (void *)0xd) break;
                  iVar42 = (int)pvVar26;
                  if (iVar42 - 1U < 0xc) {
                    uVar45 = *n_points;
                  }
                  else {
                    uVar45 = 0;
                  }
                  bVar48 = false;
                  uVar16 = (ulong)(iVar42 + 0x80) / (ulong)(iVar42 + 1);
                  uVar39 = (0x98L << ((byte)pvVar26 & 0x3f)) + uVar16 * 8 + 0x110;
                  if (uVar39 <= sVar15) {
                    uVar16 = (sVar15 - uVar39) / (uVar16 * 8 + 0x100);
                    bVar48 = uVar45 <= uVar16;
                    if (!bVar48) {
                      uVar45 = uVar16;
                    }
                    if (uVar29 < uVar45) {
                      uVar29 = uVar45;
                    }
                  }
                  n_points = n_points + 1;
                  pvVar26 = (void *)((long)pvVar26 + 1);
                } while (bVar48);
                if (uVar29 == 0) goto LAB_00116c61;
                sVar15 = secp256k1_scratch_max_allocation(local_1ab0,scratch,5);
                pvVar26 = (void *)(sVar15 - 0xe18);
                bVar48 = pvVar26 < (void *)0xfffffffffffff8f4;
                if (sVar15 < 0x70c) {
                  bVar48 = uVar29 != 1;
                }
                p_Var46 = (_func_void_char_ptr_void_ptr *)((ulong)bVar48 + 1);
                if (sVar15 < 0x70c) goto LAB_00116c61;
                pvVar26 = (void *)(ulong)(pvVar26 < (void *)0xfffffffffffff8f4);
                local_1ae0 = (_func_void_char_ptr_void_ptr *)0x2;
                local_1960 = (ulong *)(2 - (long)pvVar26);
                n_points = (ulong *)0x0;
                local_1970 = pvVar26;
                local_1968 = p_Var46;
                do {
                  num = p_Var46;
                  if (local_1ae0 < p_Var46) {
                    num = local_1ae0;
                  }
                  lVar11 = (long)n_points << ((byte)pvVar26 & 0x3f);
                  local_1a58 = &na;
                  if (n_points != (ulong *)0x0) {
                    local_1a58 = (secp256k1_scalar *)0x0;
                  }
                  psVar14 = (secp256k1_gej *)0x0;
                  do {
                    bVar2 = *(byte *)((long)&psVar14[0x1f05].z.magnitude + 3);
                    iVar42 = (uint)scratch->magic[(long)(psVar14->x).n] - (uint)bVar2;
                    if (scratch->magic[(long)(psVar14->x).n] != bVar2) goto LAB_00116d77;
                    psVar14 = (secp256k1_gej *)((long)(psVar14->x).n + 1);
                  } while (psVar14 != (secp256k1_gej *)0x8);
                  iVar42 = 0;
LAB_00116d77:
                  if (iVar42 == 0) {
                    local_1ad8 = scratch->alloc_size;
                  }
                  else {
                    (*(ctx->error_callback).fn)("invalid scratch space",(ctx->error_callback).data);
                    local_1ad8 = 0;
                  }
                  secp256k1_gej_set_infinity((secp256k1_gej *)&nums_x);
                  error_callback = local_1ab0;
                  if (local_1ae0 == (_func_void_char_ptr_void_ptr *)0x0 && n_points != (ulong *)0x0)
                  {
                    uVar43 = 0;
                  }
                  else {
                    psVar17 = (secp256k1_gej *)
                              secp256k1_scratch_alloc(local_1ab0,scratch,(long)num * 0x98);
                    psVar18 = (secp256k1_scalar *)
                              secp256k1_scratch_alloc(error_callback,scratch,(long)num * 4);
                    pvVar26 = secp256k1_scratch_alloc(error_callback,scratch,(long)num * 0xc0);
                    _ng_1 = (secp256k1_fe *)pvVar26;
                    pvVar19 = secp256k1_scratch_alloc(error_callback,scratch,(long)num * 0x1a0);
                    psStack_1a90 = (secp256k1_fe *)pvVar19;
                    pvVar20 = secp256k1_scratch_alloc(error_callback,scratch,(long)num * 0x410);
                    local_1a88._0_8_ = pvVar20;
                    iVar7 = (int)((ulong)psVar17 >> 0x20);
                    auVar50._0_4_ = -(uint)((int)psVar17 == 0 && iVar7 == 0);
                    auVar50._4_4_ = -(uint)((int)psVar18 == 0 && (int)((ulong)psVar18 >> 0x20) == 0)
                    ;
                    auVar50._8_4_ = -(uint)((int)pvVar26 == 0 && (int)((ulong)pvVar26 >> 0x20) == 0)
                    ;
                    auVar50._12_4_ =
                         -(uint)((int)pvVar19 == 0 && (int)((ulong)pvVar19 >> 0x20) == 0);
                    iVar42 = movmskps((int)psVar17,auVar50);
                    psVar14 = (secp256k1_gej *)
                              CONCAT71((int7)(CONCAT44(iVar7,iVar42) >> 8),
                                       iVar42 != 0 || pvVar20 == (void *)0x0);
                    local_1a50 = (int)psVar14;
                    if (iVar42 == 0 && pvVar20 != (void *)0x0) {
                      if (local_1ae0 != (_func_void_char_ptr_void_ptr *)0x0) {
                        puVar28 = (uint64_t *)(seed16 + lVar11 * 0x68 + 8);
                        p_Var46 = (_func_void_char_ptr_void_ptr *)0x0;
                        psVar14 = psVar17;
                        do {
                          psVar18[(long)p_Var46] =
                               *(secp256k1_scalar *)(seed16 + (long)p_Var46 * 4 + lVar11 * 4);
                          puVar21 = puVar28;
                          psVar33 = &tmp_3;
                          for (lVar24 = 0xd; lVar24 != 0; lVar24 = lVar24 + -1) {
                            (psVar33->x).n[0] = *puVar21;
                            puVar21 = puVar21 + (ulong)bVar49 * -2 + 1;
                            psVar33 = (secp256k1_gej *)((long)psVar33 + (ulong)bVar49 * -0x10 + 8);
                          }
                          secp256k1_gej_set_ge(psVar14,(secp256k1_ge *)&tmp_3);
                          p_Var46 = p_Var46 + 1;
                          psVar14 = psVar14 + 1;
                          puVar28 = puVar28 + 0xd;
                        } while (num != p_Var46);
                      }
                      secp256k1_ecmult_strauss_wnaf
                                ((secp256k1_strauss_state *)&ng_1,(secp256k1_gej *)&nums_x,
                                 (size_t)num,psVar17,psVar18,local_1a58);
                      psVar14 = psVar17;
                    }
                    secp256k1_scratch_apply_checkpoint(local_1ab0,scratch,local_1ad8);
                    p_Var46 = local_1968;
                    pvVar26 = local_1970;
                    uVar43 = local_1a50;
                  }
                  if ((char)uVar43 == '\0') {
                    secp256k1_gej_add_var
                              ((secp256k1_gej *)&scalar_i,(secp256k1_gej *)&scalar_i,
                               (secp256k1_gej *)&nums_x,&psVar14->x);
                    local_1ae0 = local_1ae0 + -(long)num;
                  }
                  n_points = (ulong *)((long)n_points + 1);
                } while ((char)uVar43 == '\0' && n_points != local_1960);
              }
              p_Var46 = local_1978;
              uVar34 = local_1990;
              uVar8 = (int)local_1978 * (int)local_1990 + (int)local_1988;
              ge_equals_gej(group + (uVar8 - (uVar8 / 0xd + (uVar8 / 0xd) * 0xc)),
                            (secp256k1_gej *)&scalar_i);
              p_Var46 = p_Var46 + 1;
            } while (p_Var46 != (_func_void_char_ptr_void_ptr *)0xd);
          }
          local_1a60 = local_1a60 + 1;
        } while (local_1a60 != 0xd);
        local_1aa0 = local_1aa0 + 1;
      } while (local_1aa0 != 0xd);
      uVar34 = uVar34 + 1;
    } while (uVar34 != 0xd);
    local_1aa8 = local_1aa8 + 1;
  } while (local_1aa8 != 0xd);
  secp256k1_scratch_destroy(local_1ab0,scratch);
  iVar42 = 1;
  uVar29 = 0;
  do {
    iVar7 = 1;
    do {
      bVar48 = true;
      if ((ulong)num_cores != 1) {
        uVar29 = uVar29 + 0xe7037ed1a0b428db;
        bVar48 = (uint32_t)((uVar29 >> 0x20 ^ uVar29 & 0xffffffff) * (ulong)num_cores >> 0x20) ==
                 this_core;
      }
      if (bVar48) {
        tmp_3.x.n[0]._0_4_ = 1;
        iVar38 = 1;
        do {
          nums_x.n[0] = 0;
          nums_x.n[1] = 0;
          nums_x.n._16_15_ = SUB1615((undefined1  [16])0x0,0);
          nums_x.n[3]._7_1_ = (char)iVar7;
          _scalar_i = (undefined1  [16])0x0;
          local_14a8._0_15_ = SUB1615((undefined1  [16])0x0,0);
          local_14a8[0xf] = (char)iVar42;
          psVar36 = ctx;
          iVar9 = secp256k1_ecdsa_sign
                            (ctx,(secp256k1_ecdsa_signature *)seed16,(uchar *)&scalar_i,
                             (uchar *)&nums_x,secp256k1_nonce_function_smallint,&tmp_3);
          if (iVar9 != 1) {
            main_cold_8();
LAB_00117efd:
            main_cold_9();
LAB_00117f02:
            main_cold_10();
            goto LAB_00117f07;
          }
          lVar11 = 0;
          uVar8 = 0;
          do {
            uVar22 = (uint)seed16[lVar11] | uVar8 << 8;
            uVar8 = uVar22 - (uVar22 / 0xd + (uVar22 / 0xd) * 0xc);
            if (uVar22 < 0xd) {
              uVar8 = uVar22;
            }
            lVar11 = lVar11 + 1;
          } while (lVar11 != 0x20);
          uVar22 = 0;
          lVar11 = 0x20;
          do {
            uVar23 = (uint)seed16[lVar11] | uVar22 << 8;
            uVar22 = uVar23 - (uVar23 / 0xd + (uVar23 / 0xd) * 0xc);
            if (uVar23 < 0xd) {
              uVar22 = uVar23;
            }
            lVar11 = lVar11 + 1;
          } while (lVar11 != 0x40);
          psVar36 = (secp256k1_context *)&ng_1;
          r_from_k((secp256k1_scalar *)psVar36,group,(int)tmp_3.x.n[0],(int *)(ulong)uVar23);
          if (uVar8 != ng_1) goto LAB_00117efd;
          iVar9 = (int)tmp_3.x.n[0];
          uVar23 = (int)tmp_3.x.n[0] * uVar22;
          uVar8 = uVar8 * iVar7 + iVar42;
          iVar40 = uVar8 - (uVar8 / 0xd + (uVar8 / 0xd) * 0xc);
          if ((uVar23 - (uVar23 / 0xd + (uVar23 / 0xd) * 0xc) != iVar40) &&
             (uVar8 = (0xd - uVar22) * (int)tmp_3.x.n[0],
             uVar8 - (uVar8 / 0xd + (uVar8 / 0xd) * 0xc) != iVar40)) goto LAB_00117f02;
          if ((int)tmp_3.x.n[0] < iVar38) break;
          iVar38 = (int)tmp_3.x.n[0] + 1;
          tmp_3.x.n[0]._0_4_ = iVar38;
        } while (iVar9 < 0xc);
      }
      iVar7 = iVar7 + 1;
    } while (iVar7 != 0xd);
    iVar42 = iVar42 + 1;
  } while (iVar42 != 0xd);
  uVar8 = 1;
  local_1af8._0_4_ = -1;
  uVar29 = 0;
  do {
    uVar45 = 1;
    iVar42 = 2;
    do {
      iVar7 = 1;
      local_1a58 = (secp256k1_scalar *)CONCAT44(local_1a58._4_4_,iVar42);
      do {
        lVar11 = 1;
        a = (secp256k1_context *)(uVar45 & 0xffffffff);
        iVar38 = iVar42;
        do {
          bVar48 = true;
          if ((ulong)num_cores != 1) {
            uVar29 = uVar29 + 0xe7037ed1a0b428db;
            bVar48 = (uint32_t)((uVar29 >> 0x20 ^ uVar29 & 0xffffffff) * (ulong)num_cores >> 0x20)
                     == this_core;
          }
          if (bVar48) {
            uVar22 = iVar38 - ((int)((ulong)a / 0xd) + (int)((ulong)a / 0xd) * 0xc);
            piVar27 = (int *)(ulong)((uVar22 / 0xd) * 3);
            iVar40 = uVar22 - (uVar22 / 0xd + (uVar22 / 0xd) * 0xc);
            uVar16 = 0;
            uVar22 = 0;
            iVar9 = 0;
            do {
              r_from_k((secp256k1_scalar *)seed16,group,iVar9,piVar27);
              if (uVar45 == (seed16._0_8_ & 0xffffffff)) {
                bVar48 = (int)(uVar16 / 0xd) + (int)(uVar16 / 0xd) * 0xc + iVar40 == 0;
                piVar27 = (int *)(ulong)bVar48;
                uVar22 = uVar22 | bVar48;
              }
              iVar9 = iVar9 + 1;
              iVar40 = iVar40 + (int)local_1af8;
              uVar16 = (ulong)((int)uVar16 + uVar8);
            } while (iVar9 != 0xd);
            _scalar_i = (undefined1  [16])0x0;
            local_14a8._0_15_ = SUB1615((undefined1  [16])0x0,0);
            local_14a8[0xf] = (char)uVar45;
            local_1498 = (undefined1  [16])0x0;
            local_1488._0_15_ = SUB1615((undefined1  [16])0x0,0);
            local_1488[0xf] = (char)uVar8;
            psVar13 = group + lVar11;
            psVar37 = (secp256k1_ge *)seed16;
            for (lVar24 = 0xd; lVar24 != 0; lVar24 = lVar24 + -1) {
              (psVar37->x).n[0] = (psVar13->x).n[0];
              psVar13 = (secp256k1_ge *)((long)psVar13 + (ulong)bVar49 * -0x10 + 8);
              psVar37 = (secp256k1_ge *)((long)psVar37 + (ulong)bVar49 * -0x10 + 8);
            }
            secp256k1_ge_to_storage((secp256k1_ge_storage *)&nums_x,(secp256k1_ge *)seed16);
            tmp_3.y.n[1] = local_1788._8_8_;
            tmp_3.y.n[0] = local_1788._0_8_;
            tmp_3.x.magnitude = nums_x.magnitude;
            tmp_3.x.n[4] = nums_x.n[4];
            tmp_3.x.normalized = nums_x.normalized;
            tmp_3.x.n[2] = nums_x.n[2];
            tmp_3.x.n[3] = nums_x.n[3];
            tmp_3.x.n[0] = nums_x.n[0];
            tmp_3.x.n[1] = nums_x.n[1];
            nums_x.n[0] = 0;
            nums_x.n[1] = 0;
            nums_x.n._16_15_ = SUB1615((undefined1  [16])0x0,0);
            nums_x.n[3]._7_1_ = (char)iVar7;
            uVar23 = secp256k1_ecdsa_verify
                               (ctx,(secp256k1_ecdsa_signature *)&scalar_i,(uchar *)&nums_x,
                                (secp256k1_pubkey *)&tmp_3);
            if ((uVar8 < 7 & uVar22) != uVar23) goto LAB_00117f39;
          }
          lVar11 = lVar11 + 1;
          iVar38 = iVar38 + (int)uVar45;
          a = (secp256k1_context *)(ulong)(uint)((int)a + (int)uVar45);
        } while (lVar11 != 0xd);
        iVar7 = iVar7 + 1;
        iVar42 = iVar42 + 1;
      } while (iVar7 != 0xd);
      uVar45 = uVar45 + 1;
      iVar42 = (int)local_1a58 + 1;
    } while (uVar45 != 0xd);
    uVar8 = uVar8 + 1;
    local_1af8._0_4_ = (int)local_1af8 + -1;
  } while (uVar8 != 0xd);
  uVar29 = 1;
  puVar31 = local_17f8;
  psVar14 = &tmp_3;
  do {
    _ng = (undefined1  [16])0x0;
    local_1a38._0_15_ = SUB1615((undefined1  [16])0x0,0);
    local_1a38[0xf] = (char)uVar29;
    lVar11 = uVar29 - 1;
    psVar36 = ctx;
    iVar42 = secp256k1_keypair_create
                       (ctx,(secp256k1_keypair *)(seed16 + lVar11 * 0x60),(uchar *)&ng);
    if (iVar42 == 0) goto LAB_00117f7f;
    pubkey = (secp256k1_pubkey *)((long)&nums_x + lVar11 * 0x40);
    psVar36 = ctx;
    iVar42 = secp256k1_ec_pubkey_create(ctx,pubkey,(uchar *)&ng);
    if (iVar42 == 0) goto LAB_00117f84;
    pubkey_00 = (secp256k1_xonly_pubkey *)(&scalar_i + lVar11 * 0x10);
    pk_parity = &ng_1 + lVar11;
    psVar36 = ctx;
    iVar42 = secp256k1_keypair_xonly_pub
                       (ctx,pubkey_00,(int *)pk_parity,(secp256k1_keypair *)(seed16 + lVar11 * 0x60)
                       );
    if (iVar42 == 0) goto LAB_00117f89;
    puVar28 = tmp_3.x.n + uVar29 * 4 + -4;
    psVar36 = ctx;
    iVar42 = secp256k1_xonly_pubkey_serialize(ctx,(uchar *)puVar28,pubkey_00);
    if (iVar42 == 0) goto LAB_00117f8e;
    psVar36 = ctx;
    iVar42 = secp256k1_xonly_pubkey_parse(ctx,pubkey_00,(uchar *)puVar28);
    if (iVar42 == 0) goto LAB_00117f93;
    psVar36 = ctx;
    iVar42 = secp256k1_xonly_pubkey_serialize(ctx,(uchar *)&ng,pubkey_00);
    if (iVar42 == 0) goto LAB_00117f98;
    lVar11 = 0;
    do {
      bVar2 = *(byte *)((long)(psVar14->x).n + lVar11);
      bVar3 = *(byte *)((long)&ng + lVar11);
      psVar36 = (secp256k1_context *)(ulong)bVar3;
      iVar42 = (uint)bVar2 - (uint)bVar3;
      if (bVar2 != bVar3) goto LAB_0011761b;
      lVar11 = lVar11 + 1;
    } while (lVar11 != 0x20);
    iVar42 = 0;
LAB_0011761b:
    if (iVar42 != 0) goto LAB_00117f9d;
    psVar36 = ctx;
    iVar42 = secp256k1_xonly_pubkey_from_pubkey(ctx,pubkey_00,(int *)local_19b8,pubkey);
    if (iVar42 == 0) goto LAB_00117fa2;
    if (local_19b8._0_4_ != *pk_parity) goto LAB_00117fa7;
    psVar36 = ctx;
    iVar42 = secp256k1_xonly_pubkey_serialize(ctx,(uchar *)&ng,pubkey_00);
    if (iVar42 == 0) goto LAB_00117fac;
    lVar11 = 0;
    a = (secp256k1_context *)&na;
    do {
      bVar2 = *(byte *)((long)(psVar14->x).n + lVar11);
      bVar3 = *(byte *)((long)&ng + lVar11);
      psVar36 = (secp256k1_context *)(ulong)bVar3;
      iVar42 = (uint)bVar2 - (uint)bVar3;
      if (bVar2 != bVar3) goto LAB_001176a5;
      lVar11 = lVar11 + 1;
    } while (lVar11 != 0x20);
    iVar42 = 0;
LAB_001176a5:
    if (iVar42 != 0) goto LAB_00117fb1;
    secp256k1_fe_impl_set_b32_mod((secp256k1_fe *)a,(uchar *)puVar28);
    uStack_19f0 = (void *)0x1;
    secp256k1_fe_verify((secp256k1_fe *)a);
    psVar36 = a;
    iVar42 = secp256k1_fe_equal_var((secp256k1_fe *)a,&group[uVar29].x);
    if (iVar42 == 0) goto LAB_00117fb6;
    _na = group[uVar29].y.n[0];
    uStack_1a10 = group[uVar29].y.n[1];
    local_1a08 = group[uVar29].y.n[2];
    uStack_1a00 = group[uVar29].y.n[3];
    local_19f8 = (undefined4)group[uVar29].y.n[4];
    uStack_19f4 = *(undefined4 *)((long)group[uVar29].y.n + 0x24);
    uStack_19f0 = (void *)CONCAT44(group[uVar29].y.normalized,group[uVar29].y.magnitude);
    secp256k1_fe_normalize_var((secp256k1_fe *)a);
    secp256k1_fe_verify((secp256k1_fe *)a);
    if (uStack_19f0._4_4_ == 0) goto LAB_00117fbb;
    if ((na & 1) != *pk_parity) goto LAB_00117fc0;
    if (6 < uVar29) {
      lVar11 = 0;
      psVar36 = extraout_RDX;
      do {
        a = (secp256k1_context *)((ulong)psVar36 & 0xffffffff);
        bVar2 = *(byte *)((long)(psVar14->x).n + lVar11);
        bVar3 = puVar31[lVar11];
        psVar36 = (secp256k1_context *)(ulong)((uint)bVar2 - (uint)bVar3);
        if (bVar2 == bVar3) {
          psVar36 = a;
        }
        iVar42 = (int)psVar36;
        if (bVar2 != bVar3) goto LAB_00117784;
        lVar11 = lVar11 + 1;
      } while (lVar11 != 0x20);
      iVar42 = 0;
LAB_00117784:
      if (iVar42 != 0) goto LAB_00117fd9;
      if (*pk_parity != 1 - (&ng_1)[0xc - uVar29]) goto LAB_00117fde;
    }
    uVar29 = uVar29 + 1;
    psVar14 = (secp256k1_gej *)((psVar14->x).n + 4);
    puVar31 = puVar31 + -0x20;
  } while (uVar29 != 0xd);
  lVar11 = 0;
  do {
    a = ctx;
    iVar42 = secp256k1_xonly_pubkey_parse
                       (ctx,(secp256k1_xonly_pubkey *)seed16,invalid_pubkey_bytes[0] + lVar11);
    if (iVar42 != 0) goto LAB_00117fc5;
    lVar11 = lVar11 + 0x20;
    keypair = (secp256k1_keypair *)seed16;
  } while (lVar11 != 0xe0);
  lVar11 = -0xc;
  psVar25 = &nums_x;
  psVar18 = &na;
  output32 = &scalar_i;
  do {
    tmp_3.x.n[0] = 0;
    tmp_3.x.n[1] = 0;
    tmp_3.x.n._16_15_ = SUB1615((undefined1  [16])0x0,0);
    tmp_3.x.n[3]._7_1_ = (char)lVar11 + '\r';
    a = ctx;
    iVar42 = secp256k1_keypair_create(ctx,keypair,(uchar *)&tmp_3);
    if (iVar42 == 0) goto LAB_00117fca;
    a = ctx;
    iVar42 = secp256k1_keypair_xonly_pub
                       (ctx,(secp256k1_xonly_pubkey *)psVar25,(int *)psVar18,keypair);
    if (iVar42 == 0) goto LAB_00117fcf;
    a = ctx;
    iVar42 = secp256k1_xonly_pubkey_serialize
                       (ctx,(uchar *)output32,(secp256k1_xonly_pubkey *)psVar25);
    if (iVar42 == 0) goto LAB_00117fd4;
    output32 = output32 + 8;
    psVar18 = psVar18 + 1;
    psVar25 = (secp256k1_fe *)(psVar25[1].n + 2);
    keypair = keypair + 1;
    lVar11 = lVar11 + 1;
  } while (lVar11 != 0);
  extraparams.ndata = (void *)0x0;
  extraparams.magic[0] = 0xda;
  extraparams.magic[1] = 'o';
  extraparams.magic[2] = 0xb3;
  extraparams.magic[3] = 0x8c;
  extraparams._4_4_ = 0;
  extraparams.noncefp = (secp256k1_nonce_function_hardened)0x0;
  lVar11 = 1;
  local_1af8 = 0;
  do {
    iVar42 = 0xd - (int)lVar11;
    if ((&iStack_1a1c)[lVar11] == 0) {
      iVar42 = (int)lVar11;
    }
    local_1ab4 = 1;
    do {
      local_1a78 = (undefined1  [16])0x0;
      local_1a88 = (undefined1  [16])0x0;
      _ng_1 = (undefined1  [16])0x0;
      local_1a68 = 0;
      bVar48 = true;
      if ((ulong)num_cores != 1) {
        local_1af8 = local_1af8 + 0xe7037ed1a0b428db;
        bVar48 = (uint32_t)
                 ((local_1af8 >> 0x20 ^ local_1af8 & 0xffffffff) * (ulong)num_cores >> 0x20) ==
                 this_core;
      }
      if (bVar48) {
        extraparams.noncefp = secp256k1_hardened_nonce_function_smallint;
        extraparams.ndata = &local_1ab4;
        iVar7 = 0xd - local_1ab4;
        if ((&iStack_1a1c)[local_1ab4] == 0) {
          iVar7 = local_1ab4;
        }
        iVar38 = 0;
        do {
          secp256k1_testrand256((uchar *)&ng);
          secp256k1_schnorrsig_challenge
                    (&e,(uchar *)(local_14d8 + (long)local_1ab4 * 4),(uchar *)&ng,0x20,
                     (uchar *)(&scalar_i + (lVar11 + -1) * 8));
          uVar29 = (ulong)e;
          if ((&ng_1)[uVar29] == 0) {
            uVar8 = e * iVar42 + iVar7;
            local_19b8 = (undefined1  [16])0x0;
            local_19a8._0_15_ = SUB1615((undefined1  [16])0x0,0);
            local_19a8[0xf] = (char)uVar8 - ((char)(uVar8 / 0xd) + (char)(uVar8 / 0xd) * '\f');
            a = ctx;
            iVar9 = secp256k1_schnorrsig_sign_custom
                              (ctx,(uchar *)&tmp_3,(uchar *)&ng,0x20,
                               (secp256k1_keypair *)(seed16 + (lVar11 + -1) * 0x60),&extraparams);
            if (iVar9 == 0) goto LAB_00117f61;
            puVar28 = local_14d8;
            puVar21 = puVar28 + (long)local_1ab4 * 4;
            lVar24 = 0;
            do {
              puVar35 = (uint64_t *)((ulong)puVar28 & 0xffffffff);
              bVar2 = *(byte *)((long)tmp_3.x.n + lVar24);
              a = (secp256k1_context *)(ulong)bVar2;
              bVar3 = *(byte *)((long)puVar21 + lVar24);
              puVar28 = (uint64_t *)(ulong)((uint)bVar2 - (uint)bVar3);
              if (bVar2 == bVar3) {
                puVar28 = puVar35;
              }
              iVar9 = (int)puVar28;
              if (bVar2 != bVar3) goto LAB_00117aa3;
              lVar24 = lVar24 + 1;
            } while (lVar24 != 0x20);
            iVar9 = 0;
LAB_00117aa3:
            if (iVar9 != 0) goto LAB_00117f66;
            lVar24 = 0;
            do {
              puVar28 = (uint64_t *)((ulong)puVar21 & 0xffffffff);
              bVar2 = *(byte *)((long)tmp_3.x.n + lVar24 + 0x20);
              bVar3 = local_19b8[lVar24];
              a = (secp256k1_context *)(ulong)bVar3;
              puVar21 = (uint64_t *)(ulong)((uint)bVar2 - (uint)bVar3);
              if (bVar2 == bVar3) {
                puVar21 = puVar28;
              }
              iVar9 = (int)puVar21;
              if (bVar2 != bVar3) goto LAB_00117ad6;
              lVar24 = lVar24 + 1;
            } while (lVar24 != 0x20);
            iVar9 = 0;
LAB_00117ad6:
            if (iVar9 != 0) goto LAB_00117f6b;
            (&ng_1)[uVar29] = 1;
            iVar38 = iVar38 + 1;
          }
        } while (iVar38 < 0xd);
      }
      iVar7 = local_1ab4 + 1;
      bVar48 = local_1ab4 < 0xc;
      local_1ab4 = iVar7;
    } while (bVar48);
    lVar11 = lVar11 + 1;
  } while (lVar11 != 0xd);
  local_1ac0 = (char **)0x1;
  local_1ad8 = 0;
  do {
    lVar11 = (long)local_1ac0 + -1;
    local_1a38 = *(undefined1 (*) [16])(local_14a8 + lVar11 * 0x20);
    iVar42 = 0xd - (int)local_1ac0;
    if ((&iStack_1a1c)[(long)local_1ac0] == 0) {
      iVar42 = (int)local_1ac0;
    }
    uStack_1a40 = *(undefined8 *)(local_14a8 + lVar11 * 0x20 + -8);
    _ng = *(undefined8 *)(&scalar_i + lVar11 * 8);
    p1 = (uchar *)0x1;
    do {
      local_1a78 = (undefined1  [16])0x0;
      local_1a88 = (undefined1  [16])0x0;
      _ng_1 = (undefined1  [16])0x0;
      local_1a68 = 0;
      bVar48 = true;
      if ((ulong)num_cores != 1) {
        local_1ad8 = local_1ad8 + 0xe7037ed1a0b428db;
        bVar48 = (uint32_t)
                 ((local_1ad8 >> 0x20 ^ local_1ad8 & 0xffffffff) * (ulong)num_cores >> 0x20) ==
                 this_core;
      }
      if (bVar48) {
        iVar7 = (int)p1;
        if (p1 < (uchar *)0x7) {
          lVar24 = (long)(p1 + -1) * 0x20;
          tmp_3.x.n._16_16_ = *(undefined1 (*) [16])(local_14a8 + lVar24);
          tmp_3.x.n[1] = *(uint64_t *)(local_14a8 + lVar24 + -8);
          tmp_3.x.n[0] = *(uint64_t *)(&scalar_i + (long)(p1 + -1) * 8);
          iVar38 = 0xd - iVar7;
          if ((&iStack_1a1c)[(long)p1] == 0) {
            iVar38 = iVar7;
          }
        }
        else {
          tmp_3.x.n._0_16_ = *(undefined1 (*) [16])invalid_pubkey_bytes[iVar7 - 7U];
          tmp_3.x.n._16_16_ = *(undefined1 (*) [16])(invalid_pubkey_bytes[iVar7 - 7U] + 0x10);
          iVar38 = -1;
        }
        iVar7 = 0;
        do {
          secp256k1_testrand256(local_19b8);
          secp256k1_schnorrsig_challenge
                    ((secp256k1_scalar *)&extraparams,(uchar *)&tmp_3,local_19b8,0x20,(uchar *)&ng);
          uVar29 = extraparams._0_8_ & 0xffffffff;
          if ((&ng_1)[uVar29] == 0) {
            uVar8 = (int)extraparams.magic * iVar42 + iVar38;
            iVar9 = 0;
            uVar22 = 0;
            do {
              if (iVar9 == 0xe) {
                secp256k1_testrand256((uchar *)(tmp_3.x.n + 4));
                uVar23 = 0;
              }
              else {
                tmp_3.x.n[4] = 0;
                tmp_3.x.magnitude = 0;
                tmp_3.x.normalized = 0;
                tmp_3.y.n._0_15_ = SUB1615((undefined1  [16])0x0,0);
                tmp_3.y.n[1]._7_1_ = (char)iVar9;
                uVar23 = 0;
                if (iVar9 != 0xd && iVar38 != -1) {
                  uVar23 = (uint)(uVar8 - (uVar8 / 0xd + (uVar8 / 0xd) * 0xc) == iVar9);
                }
              }
              a = ctx;
              uVar10 = secp256k1_schnorrsig_verify
                                 (ctx,(uchar *)&tmp_3,local_19b8,0x20,
                                  (secp256k1_xonly_pubkey *)((long)&nums_x + lVar11 * 0x40));
              if (uVar10 != uVar23) goto LAB_00117f70;
              uVar22 = uVar22 + uVar10;
              iVar9 = iVar9 + 1;
            } while (iVar9 != 0xf);
            if (uVar22 != (iVar38 != -1)) goto LAB_00117fe3;
            (&ng_1)[uVar29] = 1;
            iVar7 = iVar7 + 1;
          }
        } while (iVar7 < 0xd);
      }
      p1 = p1 + 1;
    } while (p1 != (uchar *)0xe);
    local_1ac0 = (char **)((long)local_1ac0 + 1);
  } while (local_1ac0 != (char **)0x7);
  lVar11 = -0xc;
  psVar13 = group;
  do {
    psVar13 = psVar13 + 1;
    tmp_3.x.n[0] = 0;
    tmp_3.x.n[1] = 0;
    tmp_3.x.n._16_15_ = SUB1615((undefined1  [16])0x0,0);
    tmp_3.x.n[3]._7_1_ = (char)lVar11 + '\r';
    a = ctx;
    iVar42 = secp256k1_ellswift_create(ctx,(uchar *)&nums_x,(uchar *)&tmp_3,(uchar *)0x0);
    if (iVar42 == 0) goto LAB_00117fe8;
    secp256k1_ellswift_decode(ctx,(secp256k1_pubkey *)&scalar_i,(uchar *)&nums_x);
    secp256k1_pubkey_load(ctx,(secp256k1_ge *)seed16,(secp256k1_pubkey *)&scalar_i);
    ge_equals_ge((secp256k1_ge *)seed16,psVar13);
    lVar11 = lVar11 + 1;
  } while (lVar11 != 0);
  secp256k1_context_destroy(ctx);
  local_1ac0 = (char **)0x7;
  iVar42 = count;
  goto joined_r0x001160d6;
LAB_00117f07:
  main_cold_43();
LAB_00117f0c:
  main_cold_42();
LAB_00117f11:
  a = psVar36;
  main_cold_39();
LAB_00117f16:
  main_cold_38();
LAB_00117f1b:
  main_cold_4();
LAB_00117f20:
  main_cold_5();
LAB_00117f25:
  main_cold_47();
LAB_00117f2a:
  main_cold_46();
LAB_00117f2f:
  main_cold_6();
LAB_00117f34:
  main_cold_7();
LAB_00117f39:
  main_cold_11();
LAB_00117f3e:
  main_cold_41();
LAB_00117f43:
  main_cold_51();
LAB_00117f48:
  main_cold_50();
LAB_00117f4d:
  main_cold_3();
LAB_00117f52:
  main_cold_48();
LAB_00117f57:
  main_cold_45();
LAB_00117f5c:
  main_cold_44();
LAB_00117f61:
  main_cold_24();
LAB_00117f66:
  main_cold_19();
LAB_00117f6b:
  main_cold_20();
LAB_00117f70:
  main_cold_21();
  psVar36 = a;
  goto LAB_00117f75;
}

Assistant:

int main(int argc, char** argv) {
    int i;
    secp256k1_gej groupj[EXHAUSTIVE_TEST_ORDER];
    secp256k1_ge group[EXHAUSTIVE_TEST_ORDER];
    unsigned char rand32[32];
    secp256k1_context *ctx;

    /* Disable buffering for stdout to improve reliability of getting
     * diagnostic information. Happens right at the start of main because
     * setbuf must be used before any other operation on the stream. */
    setbuf(stdout, NULL);
    /* Also disable buffering for stderr because it's not guaranteed that it's
     * unbuffered on all systems. */
    setbuf(stderr, NULL);

    printf("Exhaustive tests for order %lu\n", (unsigned long)EXHAUSTIVE_TEST_ORDER);

    /* find iteration count */
    if (argc > 1) {
        count = strtol(argv[1], NULL, 0);
    }
    printf("test count = %i\n", count);

    /* find random seed */
    secp256k1_testrand_init(argc > 2 ? argv[2] : NULL);

    /* set up split processing */
    if (argc > 4) {
        num_cores = strtol(argv[3], NULL, 0);
        this_core = strtol(argv[4], NULL, 0);
        if (num_cores < 1 || this_core >= num_cores) {
            fprintf(stderr, "Usage: %s [count] [seed] [numcores] [thiscore]\n", argv[0]);
            return 1;
        }
        printf("running tests for core %lu (out of [0..%lu])\n", (unsigned long)this_core, (unsigned long)num_cores - 1);
    }

    /* Recreate the ecmult{,_gen} tables using the right generator (as selected via EXHAUSTIVE_TEST_ORDER) */
    secp256k1_ecmult_gen_compute_table(&secp256k1_ecmult_gen_prec_table[0][0], &secp256k1_ge_const_g, ECMULT_GEN_PREC_BITS);
    secp256k1_ecmult_compute_two_tables(secp256k1_pre_g, secp256k1_pre_g_128, WINDOW_G, &secp256k1_ge_const_g);

    while (count--) {
        /* Build context */
        ctx = secp256k1_context_create(SECP256K1_CONTEXT_NONE);
        secp256k1_testrand256(rand32);
        CHECK(secp256k1_context_randomize(ctx, rand32));

        /* Generate the entire group */
        secp256k1_gej_set_infinity(&groupj[0]);
        secp256k1_ge_set_gej(&group[0], &groupj[0]);
        for (i = 1; i < EXHAUSTIVE_TEST_ORDER; i++) {
            secp256k1_gej_add_ge(&groupj[i], &groupj[i - 1], &secp256k1_ge_const_g);
            secp256k1_ge_set_gej(&group[i], &groupj[i]);
            if (count != 0) {
                /* Set a different random z-value for each Jacobian point, except z=1
                   is used in the last iteration. */
                secp256k1_fe z;
                random_fe(&z);
                secp256k1_gej_rescale(&groupj[i], &z);
            }

            /* Verify against ecmult_gen */
            {
                secp256k1_scalar scalar_i;
                secp256k1_gej generatedj;
                secp256k1_ge generated;

                secp256k1_scalar_set_int(&scalar_i, i);
                secp256k1_ecmult_gen(&ctx->ecmult_gen_ctx, &generatedj, &scalar_i);
                secp256k1_ge_set_gej(&generated, &generatedj);

                CHECK(group[i].infinity == 0);
                CHECK(generated.infinity == 0);
                CHECK(secp256k1_fe_equal_var(&generated.x, &group[i].x));
                CHECK(secp256k1_fe_equal_var(&generated.y, &group[i].y));
            }
        }

        /* Run the tests */
        test_exhaustive_endomorphism(group);
        test_exhaustive_addition(group, groupj);
        test_exhaustive_ecmult(group, groupj);
        test_exhaustive_ecmult_multi(ctx, group);
        test_exhaustive_sign(ctx, group);
        test_exhaustive_verify(ctx, group);

#ifdef ENABLE_MODULE_RECOVERY
        test_exhaustive_recovery(ctx, group);
#endif
#ifdef ENABLE_MODULE_EXTRAKEYS
        test_exhaustive_extrakeys(ctx, group);
#endif
#ifdef ENABLE_MODULE_SCHNORRSIG
        test_exhaustive_schnorrsig(ctx);
#endif
#ifdef ENABLE_MODULE_ELLSWIFT
    /* The ellswift algorithm does have additional edge cases when operating on
     * curves of even order, which are not included in the code as secp256k1 is
     * of odd order. Skip the ellswift tests if the used exhaustive tests curve
     * is even-ordered accordingly. */
    #if !EXHAUSTIVE_TEST_CURVE_HAS_EVEN_ORDER
        test_exhaustive_ellswift(ctx, group);
    #endif
#endif

        secp256k1_context_destroy(ctx);
    }

    secp256k1_testrand_finish();

    printf("no problems found\n");
    return 0;
}